

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCheckHeight(Parse *pParse,int nHeight)

{
  uint uVar1;
  uint local_18;
  int mxHeight;
  int rc;
  int nHeight_local;
  Parse *pParse_local;
  
  uVar1 = pParse->db->aLimit[3];
  if ((int)uVar1 < nHeight) {
    sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)",(ulong)uVar1);
  }
  local_18 = (uint)((int)uVar1 < nHeight);
  return local_18;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckHeight(Parse *pParse, int nHeight){
  int rc = SQLITE_OK;
  int mxHeight = pParse->db->aLimit[SQLITE_LIMIT_EXPR_DEPTH];
  if( nHeight>mxHeight ){
    sqlite3ErrorMsg(pParse, 
       "Expression tree is too large (maximum depth %d)", mxHeight
    );
    rc = SQLITE_ERROR;
  }
  return rc;
}